

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# class.cpp
# Opt level: O0

void __thiscall
LiteScript::_Type_CLASS::GarbageCollector
          (_Type_CLASS *this,Variable *object,offset_in_Memory_to_subr caller)

{
  Object *pOVar1;
  ulong uVar2;
  size_type sVar3;
  const_reference v;
  offset_in_Memory_to_subr in_RCX;
  long *plVar4;
  Class *local_110;
  undefined1 local_e8 [24];
  uint sz_3;
  uint i_3;
  pointer local_c8;
  undefined1 local_c0 [24];
  uint sz_2;
  uint i_2;
  pointer local_a0;
  undefined1 local_98 [28];
  uint sz_1;
  uint i_1;
  Class *local_70;
  pointer local_68;
  Variable local_60;
  uint local_50;
  uint local_4c;
  uint sz;
  uint i;
  vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_> *inherits;
  Class *C;
  offset_in_Memory_to_subr caller_local;
  Variable *local_28;
  Variable *object_local;
  _Type_CLASS *this_local;
  
  C = (Class *)caller;
  caller_local = in_RCX;
  local_28 = object;
  object_local = (Variable *)this;
  this_local = (_Type_CLASS *)caller;
  pOVar1 = Variable::operator->(object);
  plVar4 = (long *)((long)(pOVar1->memory->arr)._M_elems + caller_local);
  if (((ulong)C & 1) == 0) {
    local_110 = C;
  }
  else {
    local_110 = *(Class **)((C->op_members)._M_elems[0].data + *plVar4 + -0x49);
  }
  pOVar1 = Variable::operator->(local_28);
  uVar2 = (*(code *)local_110)(plVar4,pOVar1->ID);
  if ((uVar2 & 1) == 0) {
    pOVar1 = Variable::operator->(local_28);
    inherits = &Object::GetData<LiteScript::Class>(pOVar1)->inherit;
    _sz = Class::GetInherits((Class *)inherits);
    local_4c = 0;
    sVar3 = std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>::size(_sz);
    local_50 = (uint)sVar3;
    for (; local_4c < local_50; local_4c = local_4c + 1) {
      v = std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>::operator[]
                    (_sz,(ulong)local_4c);
      Variable::Variable(&local_60,v);
      local_68 = (pointer)caller_local;
      local_70 = C;
      Variable::GarbageCollector(&local_60,(offset_in_Memory_to_subr)C);
      Variable::~Variable(&local_60);
    }
    local_98._24_4_ = 0;
    local_98._20_4_ = Class::GetStaticCount((Class *)inherits);
    for (; (uint)local_98._24_4_ < (uint)local_98._20_4_; local_98._24_4_ = local_98._24_4_ + 1) {
      Class::GetStaticMember((Class *)local_98,(uint)inherits);
      local_a0 = (pointer)caller_local;
      _sz_2 = C;
      Variable::GarbageCollector((Variable *)local_98,(offset_in_Memory_to_subr)C);
      Variable::~Variable((Variable *)local_98);
    }
    local_c0._20_4_ = 0;
    local_c0._16_4_ = Class::GetUnstaticCount((Class *)inherits);
    for (; (uint)local_c0._20_4_ < (uint)local_c0._16_4_; local_c0._20_4_ = local_c0._20_4_ + 1) {
      Class::GetUnstaticMember((Class *)local_c0,(uint)inherits);
      local_c8 = (pointer)caller_local;
      _sz_3 = C;
      Variable::GarbageCollector((Variable *)local_c0,(offset_in_Memory_to_subr)C);
      Variable::~Variable((Variable *)local_c0);
    }
    local_e8._16_4_ = 0x21;
    for (local_e8._20_4_ = 0; (uint)local_e8._20_4_ < (uint)local_e8._16_4_;
        local_e8._20_4_ = local_e8._20_4_ + 1) {
      Class::GetOperator((Class *)local_e8,(uint)inherits);
      Variable::GarbageCollector((Variable *)local_e8,(offset_in_Memory_to_subr)C);
      Variable::~Variable((Variable *)local_e8);
    }
  }
  return;
}

Assistant:

void LiteScript::_Type_CLASS::GarbageCollector(const Variable &object, bool (Memory::*caller)(unsigned int)) const {
    if ((object->memory.*caller)(object->ID))
        return;
    const Class& C = object->GetData<Class>();
    const std::vector<LiteScript::Variable>& inherits = C.GetInherits();
    for (unsigned int i = 0, sz = inherits.size(); i < sz; i++)
        Variable(inherits[i]).GarbageCollector(caller);
    for (unsigned int i = 0, sz = C.GetStaticCount(); i < sz; i++)
        C.GetStaticMember(i).GarbageCollector(caller);
    for (unsigned int i = 0, sz = C.GetUnstaticCount(); i < sz; i++)
        C.GetUnstaticMember(i).GarbageCollector(caller);
    for (unsigned int i = 0, sz = Class::OperatorType::OP_TYPE_NUMBER; i < sz; i++)
        C.GetOperator(i).GarbageCollector(caller);
}